

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::reserve
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,size_t n
          )

{
  json_storage_kind jVar1;
  array_storage *this_00;
  json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  *this_01;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RSI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  if (in_RSI != (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x0) {
    jVar1 = storage_kind(in_RDI);
    this_01 = (json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
               *)(ulong)(byte)(jVar1 - empty_object);
    switch(this_01) {
    case (json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
          *)0x0:
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      create_object_implicitly<std::allocator<char>>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 this_01);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 this_01);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
      value_abi_cxx11_((object_storage *)this);
      order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
      ::reserve((order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
                 *)this_01,in_stack_ffffffffffffffd8);
      break;
    default:
      break;
    case (json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
          *)0x5:
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 this_01);
      json_reference_storage::value((json_reference_storage *)0x1cf3c4);
      reserve(in_RSI,(size_t)in_RDI);
      break;
    case (json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
          *)0x9:
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 this_01);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
      value_abi_cxx11_((object_storage *)this);
      order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
      ::reserve((order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
                 *)this_01,in_stack_ffffffffffffffd8);
      break;
    case (json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
          *)0xa:
      this_00 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::array_storage>
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)this_01);
      array_storage::value(this_00);
      json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
      ::reserve(this_01,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void reserve(std::size_t n)
        {
            if (n > 0)
            {
                switch (storage_kind())
                {
                    case json_storage_kind::array:
                        cast<array_storage>().value().reserve(n);
                        break;
                    case json_storage_kind::empty_object:
                        create_object_implicitly();
                        cast<object_storage>().value().reserve(n);
                        break;
                    case json_storage_kind::object:
                        cast<object_storage>().value().reserve(n);
                        break;
                    case json_storage_kind::json_reference:
                        cast<json_reference_storage>().value().reserve(n);
                        break;
                    default:
                        break;
                }
            }
        }